

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O0

int __thiscall
TFileNameDatabase::CreateDatabase(TFileNameDatabase *this,LPBYTE pbMarData,size_t cbMarData)

{
  int iVar1;
  int local_60;
  uint local_5c;
  int nError;
  DWORD dwSignature;
  TByteStream ByteStream;
  size_t cbMarData_local;
  LPBYTE pbMarData_local;
  TFileNameDatabase *this_local;
  
  ByteStream.hMap = (HANDLE)cbMarData;
  TByteStream::TByteStream((TByteStream *)&nError);
  if ((pbMarData == (LPBYTE)0x0) && (ByteStream.hMap != (HANDLE)0x0)) {
    return 0x16;
  }
  local_60 = TByteStream::SetByteBuffer((TByteStream *)&nError,pbMarData,(size_t)ByteStream.hMap);
  if (local_60 == 0) {
    iVar1 = TByteStream::GetValue<unsigned_int>((TByteStream *)&nError,&local_5c);
    if (iVar1 != 0) {
      return iVar1;
    }
    if (local_5c != 0x52414d) {
      return 1000;
    }
    local_60 = LoadFromStream(this,(TByteStream *)&nError);
  }
  return local_60;
}

Assistant:

int CreateDatabase(LPBYTE pbMarData, size_t cbMarData)
    {
        TByteStream ByteStream;
        DWORD dwSignature;
        int nError;

        if(pbMarData == NULL && cbMarData != 0)
            return ERROR_INVALID_PARAMETER;

        nError = ByteStream.SetByteBuffer(pbMarData, cbMarData);
        if(nError == ERROR_SUCCESS)
        {
            // Get pointer to MAR signature
            nError = ByteStream.GetValue<DWORD>(dwSignature);
            if(nError != ERROR_SUCCESS)
                return nError;

            // Verify the signature
            if(dwSignature != MNDX_MAR_SIGNATURE)
                return ERROR_BAD_FORMAT;

            // HOTS: 1956E11
            nError = LoadFromStream(ByteStream);
        }

        return nError;
    }